

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::DestroyContents(Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                  *this)

{
  bool bVar1;
  allocator<absl::lts_20240722::status_internal::Payload> *allocator;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> destroy_size;
  undefined8 local_28;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> data;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *this_local;
  
  bVar1 = GetIsAllocated(this);
  if (bVar1) {
    local_28 = GetAllocatedData(this);
  }
  else {
    local_28 = GetInlinedData(this);
  }
  allocator = GetAllocator(this);
  destroy_size = GetSize(this);
  DestroyAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_false>::
  DestroyElements(allocator,local_28,destroy_size);
  DeallocateIfAllocated(this);
  return;
}

Assistant:

void Storage<T, N, A>::DestroyContents() {
  Pointer<A> data = GetIsAllocated() ? GetAllocatedData() : GetInlinedData();
  DestroyAdapter<A>::DestroyElements(GetAllocator(), data, GetSize());
  DeallocateIfAllocated();
}